

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O2

PianoWidget * __thiscall PianoWidget::getPixmap(PianoWidget *this,Pixmaps id)

{
  char cVar1;
  uint in_EDX;
  QString key;
  QArrayDataPointer<char16_t> local_30;
  
  QPixmap::QPixmap((QPixmap *)this);
  QString::QString((QString *)&local_30,*(char **)(PianoWidgetTU::PIXMAP_PATHS + (ulong)in_EDX * 8))
  ;
  cVar1 = QPixmapCache::find((QString *)&local_30,(QPixmap *)this);
  if (cVar1 == '\0') {
    QPixmap::load(this,&local_30,0,0);
    QPixmapCache::insert((QString *)&local_30,(QPixmap *)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return this;
}

Assistant:

QPixmap PianoWidget::getPixmap(Pixmaps id) {
    QPixmap pixmap;
    QString const key = TU::PIXMAP_PATHS[id];
    if (!QPixmapCache::find(key, &pixmap)) {
        pixmap.load(key);
        QPixmapCache::insert(key, pixmap);
    }
    return pixmap;
}